

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLboolean chooseFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig fbconfig;
  int iVar1;
  int iVar2;
  uint uVar3;
  char *__s1;
  _GLFWfbconfig *p_Var4;
  _GLFWfbconfig *u;
  GLXFBConfig n;
  GLboolean trustWindowBit;
  char *vendor;
  int local_40;
  int usableCount;
  int nativeCount;
  int i;
  _GLFWfbconfig *closest;
  _GLFWfbconfig *usableConfigs;
  GLXFBConfig *nativeConfigs;
  GLXFBConfig *result_local;
  _GLFWfbconfig *desired_local;
  
  nativeConfigs = result;
  result_local = (GLXFBConfig *)desired;
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  iVar1 = strcmp(__s1,"Chromium");
  usableConfigs =
       (_GLFWfbconfig *)(*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_40);
  if (local_40 == 0) {
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
    desired_local._7_1_ = false;
  }
  else {
    closest = (_GLFWfbconfig *)calloc((long)local_40,0x48);
    vendor._4_4_ = 0;
    for (usableCount = 0; usableCount < local_40; usableCount = usableCount + 1) {
      fbconfig = *(GLXFBConfig *)(&usableConfigs->redBits + (long)usableCount * 2);
      p_Var4 = closest + (int)vendor._4_4_;
      iVar2 = getFBConfigAttrib(fbconfig,0x800b);
      if (((iVar2 != 0) && (uVar3 = getFBConfigAttrib(fbconfig,0x8011), (uVar3 & 1) != 0)) &&
         ((uVar3 = getFBConfigAttrib(fbconfig,0x8010), (uVar3 & 1) != 0 || (iVar1 == 0)))) {
        iVar2 = getFBConfigAttrib(fbconfig,8);
        p_Var4->redBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,9);
        p_Var4->greenBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,10);
        p_Var4->blueBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,0xb);
        p_Var4->alphaBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,0xc);
        p_Var4->depthBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,0xd);
        p_Var4->stencilBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,0xe);
        p_Var4->accumRedBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,0xf);
        p_Var4->accumGreenBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,0x10);
        p_Var4->accumBlueBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,0x11);
        p_Var4->accumAlphaBits = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,7);
        p_Var4->auxBuffers = iVar2;
        iVar2 = getFBConfigAttrib(fbconfig,6);
        if (iVar2 != 0) {
          p_Var4->stereo = 1;
        }
        iVar2 = getFBConfigAttrib(fbconfig,5);
        if (iVar2 != 0) {
          p_Var4->doublebuffer = 1;
        }
        if (_glfw.glx.ARB_multisample != '\0') {
          iVar2 = getFBConfigAttrib(fbconfig,0x186a1);
          p_Var4->samples = iVar2;
        }
        if ((_glfw.glx.ARB_framebuffer_sRGB != '\0') || (_glfw.glx.EXT_framebuffer_sRGB != '\0')) {
          iVar2 = getFBConfigAttrib(fbconfig,0x20b2);
          p_Var4->sRGB = iVar2;
        }
        p_Var4->glx = fbconfig;
        vendor._4_4_ = vendor._4_4_ + 1;
      }
    }
    _nativeCount = _glfwChooseFBConfig((_GLFWfbconfig *)result_local,closest,vendor._4_4_);
    if (_nativeCount != (_GLFWfbconfig *)0x0) {
      *nativeConfigs = _nativeCount->glx;
    }
    XFree(usableConfigs);
    free(closest);
    desired_local._7_1_ = _nativeCount != (_GLFWfbconfig *)0x0;
  }
  return desired_local._7_1_;
}

Assistant:

static GLboolean chooseFBConfig(const _GLFWfbconfig* desired, GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLboolean trustWindowBit = GL_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = _glfw_glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GL_FALSE;

    nativeConfigs = _glfw_glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen,
                                          &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GL_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider GLXFBConfigs with associated visuals
        if (!getFBConfigAttrib(n, GLX_VISUAL_ID))
            continue;

        // Only consider RGBA GLXFBConfigs
        if (!(getFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        u->redBits = getFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GL_TRUE;
        if (getFBConfigAttrib(n, GLX_DOUBLEBUFFER))
            u->doublebuffer = GL_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->glx = n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = closest->glx;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest ? GL_TRUE : GL_FALSE;
}